

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

int __thiscall
QtMWidgets::AbstractScrollAreaPrivate::init(AbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  QArrayData *pQVar1;
  int iVar2;
  long *plVar3;
  QWidget *pQVar4;
  ScrollIndicator *pSVar5;
  BlurEffect *pBVar6;
  QVariantAnimation *pQVar7;
  QTimer *pQVar8;
  Scroller *this_00;
  QByteArrayView QVar9;
  QColor ic;
  QStyleOption opt;
  QColor local_78;
  QArrayData *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  QStyleOption local_50 [40];
  undefined1 local_28 [24];
  
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  plVar3 = (long *)QPalette::brush((ColorGroup)local_28,Dark);
  local_78._0_8_ = *(undefined8 *)(*plVar3 + 8);
  local_78._8_8_ = *(undefined8 *)(*plVar3 + 0x10);
  pQVar4 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar4,this->q,0);
  this->viewport = pQVar4;
  QVar9.m_data = (storage_type *)0x16;
  QVar9.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar9);
  pQVar1 = local_68;
  uStack_58 = 0;
  local_60 = 0;
  local_68 = (QArrayData *)0x0;
  QObject::setObjectName((QString *)pQVar4);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  QWidget::setBackgroundRole((ColorRole)this->viewport);
  QWidget::setAutoFillBackground(SUB81(this->viewport,0));
  QWidget::setFocusProxy(this->viewport);
  QWidget::setContentsMargins((int)this->viewport,0,0,0);
  pSVar5 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar5,&local_78,Horizontal,this->viewport);
  this->horIndicator = pSVar5;
  pSVar5 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar5,&local_78,Vertical,this->viewport);
  this->vertIndicator = pSVar5;
  pBVar6 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar6,&local_78,Vertical,this->viewport);
  this->horBlur = pBVar6;
  pBVar6 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar6,&local_78,Horizontal,this->viewport);
  this->vertBlur = pBVar6;
  pQVar7 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar7,(QObject *)this->q);
  this->horBlurAnim = pQVar7;
  QVariantAnimation::setDuration((int)pQVar7);
  QAbstractAnimation::setLoopCount((int)this->horBlurAnim);
  pQVar7 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar7,(QObject *)this->q);
  this->vertBlurAnim = pQVar7;
  QVariantAnimation::setDuration((int)pQVar7);
  QAbstractAnimation::setLoopCount((int)this->vertBlurAnim);
  pQVar8 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar8,(QObject *)this->q);
  this->animationTimer = pQVar8;
  QTimer::setSingleShot(SUB81(pQVar8,0));
  pQVar8 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar8,(QObject *)this->q);
  this->startBlurAnimTimer = pQVar8;
  QTimer::setSingleShot(SUB81(pQVar8,0));
  this_00 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_00,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_00;
  QWidget::setFocusPolicy((FocusPolicy)this->q);
  QFrame::setFrameStyle((int)this->q);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  layoutChildren(this,local_50);
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
AbstractScrollAreaPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	const QColor ic = opt.palette.color( QPalette::Highlight );

	viewport = new QWidget( q );
	viewport->setObjectName( QLatin1String( "qt_scrollarea_viewport" ) );
	viewport->setBackgroundRole( QPalette::Base );
	viewport->setAutoFillBackground( true );
	viewport->setFocusProxy( q );
	viewport->setContentsMargins( 0, 0, 0, 0 );

	horIndicator = new ScrollIndicator( ic, Qt::Horizontal, viewport );
	vertIndicator = new ScrollIndicator( ic, Qt::Vertical, viewport );

	horBlur = new BlurEffect( ic, Qt::Vertical, viewport );
	vertBlur = new BlurEffect( ic, Qt::Horizontal, viewport );

	horBlurAnim = new QVariantAnimation( q );
	horBlurAnim->setDuration( 300 );
	horBlurAnim->setLoopCount( 1 );

	vertBlurAnim = new QVariantAnimation( q );
	vertBlurAnim->setDuration( 300 );
	vertBlurAnim->setLoopCount( 1 );

	animationTimer = new QTimer( q );
	animationTimer->setSingleShot( true );

	startBlurAnimTimer = new QTimer( q );
	startBlurAnimTimer->setSingleShot( true );

	scroller = new Scroller( q, q );

	q->setFocusPolicy( Qt::WheelFocus );
	q->setFrameStyle( QFrame::NoFrame | QFrame::Plain );
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Expanding );

	layoutChildren( opt );
}